

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_psnr_enc.c
# Opt level: O2

int WebPPlaneDistortion(uint8_t *src,size_t src_stride,uint8_t *ref,size_t ref_stride,int width,
                       int height,size_t x_step,int type,float *distortion,float *result)

{
  long lVar1;
  ulong uVar2;
  uint8_t *ptr;
  code *pcVar3;
  uint8_t *puVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  code *pcVar8;
  ulong uVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  bool bVar15;
  double dVar16;
  
  pcVar3 = AccumulateLSIM;
  if (type == 1) {
    pcVar3 = AccumulateSSIM;
  }
  pcVar8 = AccumulateSSE;
  if (type != 0) {
    pcVar8 = pcVar3;
  }
  iVar6 = 0;
  iVar7 = 0;
  if (ref != (uint8_t *)0x0 && src != (uint8_t *)0x0) {
    lVar1 = (long)width;
    uVar2 = lVar1 * x_step;
    if ((((uVar2 < src_stride || uVar2 - src_stride == 0) &&
         (iVar7 = iVar6, distortion != (float *)0x0)) &&
        (uVar2 < ref_stride || uVar2 - ref_stride == 0)) && (result != (float *)0x0)) {
      VP8SSIMDspInit();
      if (x_step == 1) {
        ptr = (uint8_t *)0x0;
        puVar4 = ref;
        puVar11 = src;
      }
      else {
        lVar14 = height * lVar1;
        ptr = (uint8_t *)WebPSafeMalloc(lVar14 * 2,1);
        if (ptr == (uint8_t *)0x0) {
          return 0;
        }
        puVar4 = ptr + lVar14;
        uVar2 = 0;
        uVar5 = 0;
        if (0 < width) {
          uVar5 = (ulong)(uint)width;
        }
        uVar9 = 0;
        puVar10 = ptr;
        if (0 < height) {
          uVar9 = (ulong)(uint)height;
        }
        for (; puVar11 = ptr, uVar2 != uVar9; uVar2 = uVar2 + 1) {
          lVar12 = 0;
          puVar11 = puVar10;
          uVar13 = uVar5;
          while (bVar15 = uVar13 != 0, uVar13 = uVar13 - 1, bVar15) {
            *puVar11 = src[lVar12];
            puVar11[lVar14] = ref[lVar12];
            lVar12 = lVar12 + x_step;
            puVar11 = puVar11 + 1;
          }
          ref = ref + ref_stride;
          src = src + src_stride;
          puVar10 = puVar10 + lVar1;
        }
      }
      dVar16 = (double)(*pcVar8)(puVar11,width,puVar4,width,width,height);
      *distortion = (float)dVar16;
      WebPSafeFree(ptr);
      if (type == 1) {
        dVar16 = GetLogSSIM((double)*distortion,(double)height * (double)width);
      }
      else {
        dVar16 = GetPSNR((double)*distortion,(double)height * (double)width);
      }
      *result = (float)dVar16;
      iVar7 = 1;
    }
  }
  return iVar7;
}

Assistant:

int WebPPlaneDistortion(const uint8_t* src, size_t src_stride,
                        const uint8_t* ref, size_t ref_stride,
                        int width, int height, size_t x_step,
                        int type, float* distortion, float* result) {
  uint8_t* allocated = NULL;
  const AccumulateFunc metric = (type == 0) ? AccumulateSSE :
                                (type == 1) ? AccumulateSSIM :
                                              AccumulateLSIM;
  if (src == NULL || ref == NULL ||
      src_stride < x_step * width || ref_stride < x_step * width ||
      result == NULL || distortion == NULL) {
    return 0;
  }

  VP8SSIMDspInit();
  if (x_step != 1) {   // extract a packed plane if needed
    int x, y;
    uint8_t* tmp1;
    uint8_t* tmp2;
    allocated =
        (uint8_t*)WebPSafeMalloc(2ULL * width * height, sizeof(*allocated));
    if (allocated == NULL) return 0;
    tmp1 = allocated;
    tmp2 = tmp1 + (size_t)width * height;
    for (y = 0; y < height; ++y) {
      for (x = 0; x < width; ++x) {
        tmp1[x + y * width] = src[x * x_step + y * src_stride];
        tmp2[x + y * width] = ref[x * x_step + y * ref_stride];
      }
    }
    src = tmp1;
    ref = tmp2;
  }
  *distortion = (float)metric(src, width, ref, width, width, height);
  WebPSafeFree(allocated);

  *result = (type == 1) ? (float)GetLogSSIM(*distortion, (double)width * height)
                        : (float)GetPSNR(*distortion, (double)width * height);
  return 1;
}